

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_ctr.c
# Opt level: O0

void qsoundc_w(void *info,UINT8 offset,UINT8 data)

{
  qsound_chip *chip;
  UINT8 data_local;
  UINT8 offset_local;
  void *info_local;
  
  if (offset == '\0') {
    *(ushort *)((long)info + 0x1c) = *(ushort *)((long)info + 0x1c) & 0xff | (ushort)data << 8;
  }
  else if (offset == '\x01') {
    *(ushort *)((long)info + 0x1c) = *(ushort *)((long)info + 0x1c) & 0xff00 | (ushort)data;
  }
  else if (offset == '\x02') {
    qsoundc_write_data(info,data,*(UINT16 *)((long)info + 0x1c));
  }
  return;
}

Assistant:

static void qsoundc_w(void* info, UINT8 offset, UINT8 data)
{
	struct qsound_chip* chip = (struct qsound_chip*)info;
	
	switch (offset)
	{
		case 0:
			chip->data_latch = (chip->data_latch & 0x00ff) | (data << 8);
			break;
		case 1:
			chip->data_latch = (chip->data_latch & 0xff00) | data;
			break;
		case 2:
			qsoundc_write_data(chip, data, chip->data_latch);
			break;
		default:
			break;
	}
	
	return;
}